

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

SectionHeader * __thiscall
Wasm::WasmBinaryReader::ReadNextSection
          (SectionHeader *__return_storage_ptr__,WasmBinaryReader *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar2;
  SectionHeader local_38;
  WasmBinaryReader *local_10;
  WasmBinaryReader *this_local;
  
  local_10 = this;
  do {
    bVar1 = EndOfModule(this);
    if (bVar1) {
      memset(&this->m_currentSection,0,0x28);
      (this->m_currentSection).code = bSectLimit;
      memcpy(__return_storage_ptr__,&this->m_currentSection,0x28);
      return __return_storage_ptr__;
    }
    ReadSectionHeader(&local_38,this);
    memcpy(&this->m_currentSection,&local_38,0x28);
    if (*(int *)(SectionInfo::All + (ulong)(this->m_currentSection).code * 0x18) != 1) {
      memcpy(__return_storage_ptr__,&this->m_currentSection,0x28);
      return __return_storage_ptr__;
    }
    pFVar2 = GetFunctionBody(this);
    if (pFVar2 == (FunctionBody *)0x0) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmSectionPhase);
      if (bVar1) goto LAB_01609ba7;
    }
    else {
      pFVar2 = GetFunctionBody(this);
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
      pFVar2 = GetFunctionBody(this);
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar2);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,WasmSectionPhase,sourceContextId,functionId);
      if (bVar1) {
LAB_01609ba7:
        Output::Print(L"Ignore this section");
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    this->m_pc = (this->m_currentSection).end;
  } while( true );
}

Assistant:

SectionHeader WasmBinaryReader::ReadNextSection()
{
    while (true)
    {
        if (EndOfModule())
        {
            memset(&m_currentSection, 0, sizeof(SectionHeader));
            m_currentSection.code = bSectLimit;
            return m_currentSection;
        }

        m_currentSection = ReadSectionHeader();
        if (SectionInfo::All[m_currentSection.code].flag == fSectIgnore)
        {
            TRACE_WASM_SECTION(_u("Ignore this section"));
            m_pc = m_currentSection.end;
            // Read next section
            continue;
        }

        return m_currentSection;
    }
}